

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Vfs_sys_get_temp_dir(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  code *pcVar2;
  
  jx9_value_string(pCtx->pRet,"",0);
  pvVar1 = pCtx->pFunc->pUserData;
  if ((pvVar1 == (void *)0x0) || (pcVar2 = *(code **)((long)pvVar1 + 0x128), pcVar2 == (code *)0x0))
  {
    jx9_context_throw_error_format
              (pCtx,2,"IO routine(%s) not implemented in the underlying VFS",
               (pCtx->pFunc->sName).zString);
  }
  else {
    (*pcVar2)(pCtx);
  }
  return 0;
}

Assistant:

static int jx9Vfs_sys_get_temp_dir(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_vfs *pVfs;
	/* Set the empty string as the default return value */
	jx9_result_string(pCtx, "", 0);
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xTempDir == 0 ){
		SXUNUSED(nArg); /* cc warning */
		SXUNUSED(apArg);
		/* IO routine not implemented, return "" */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS", 
			jx9_function_name(pCtx)
			);		
		return JX9_OK;
	}
	/* Perform the requested operation */
	pVfs->xTempDir(pCtx);
	return JX9_OK;
}